

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O0

void __thiscall
ElementsConfidentialAddress_EmptyAddressTest_Test::TestBody
          (ElementsConfidentialAddress_EmptyAddressTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_988;
  Message local_980 [2];
  CfdException *anon_var_0_1;
  byte local_7b1;
  char *pcStack_7b0;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_7a0 [2];
  CfdException *anon_var_0;
  string local_788;
  ElementsConfidentialAddress local_768;
  byte local_5a9;
  char *pcStack_5a8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ConfidentialKey key;
  Address unblind_addr;
  Message local_400;
  ConfidentialKey local_3f8;
  string local_3e0;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_1;
  Message local_3a8 [3];
  Address local_390;
  ByteData local_210;
  string local_1f8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar;
  ElementsConfidentialAddress empty_address;
  ElementsConfidentialAddress_EmptyAddressTest_Test *this_local;
  
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&gtest_ar.message_);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
            (&local_390,(ElementsConfidentialAddress *)&gtest_ar.message_);
  cfd::core::Address::GetHash(&local_210,&local_390);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1f8,&local_210);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1d8,"\"\"",
             "empty_address.GetUnblindedAddress().GetHash().GetHex().c_str()","",pcVar2);
  std::__cxx11::string::~string((string *)&local_1f8);
  cfd::core::ByteData::~ByteData(&local_210);
  cfd::core::Address::~Address(&local_390);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_3a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey
            (&local_3f8,(ElementsConfidentialAddress *)&gtest_ar.message_);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_3e0,&local_3f8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3c0,"\"\"","empty_address.GetConfidentialKey().GetHex().c_str()","",
             pcVar2);
  std::__cxx11::string::~string((string *)&local_3e0);
  cfd::core::Pubkey::~Pubkey(&local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &local_400);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &unblind_addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  cfd::core::Address::Address
            ((Address *)
             &key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::Pubkey((Pubkey *)&gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffa58,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffa58);
  if (bVar1) {
    local_5a9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_788,"",(allocator *)((long)&anon_var_0 + 7));
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_768,&local_788);
      cfd::core::ElementsConfidentialAddress::operator=
                ((ElementsConfidentialAddress *)&gtest_ar.message_,&local_768);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_768);
      std::__cxx11::string::~string((string *)&local_788);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    if ((local_5a9 & 1) == 0) {
      pcStack_5a8 = 
      "Expected: (empty_address = ElementsConfidentialAddress(\"\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_004614ed;
    }
  }
  else {
LAB_004614ed:
    testing::Message::Message(local_7a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x2a,pcStack_5a8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_7a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(local_7a0);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff850,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff850);
  if (bVar1) {
    local_7b1 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&anon_var_0_1,
                 (Address *)
                 &key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ConfidentialKey *)&gtest_msg);
      cfd::core::ElementsConfidentialAddress::operator=
                ((ElementsConfidentialAddress *)&gtest_ar.message_,
                 (ElementsConfidentialAddress *)&anon_var_0_1);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&anon_var_0_1);
    }
    if ((local_7b1 & 1) != 0) goto LAB_00461786;
    pcStack_7b0 = 
    "Expected: (empty_address = ElementsConfidentialAddress(unblind_addr, key)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_980);
  testing::internal::AssertHelper::AssertHelper
            (&local_988,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
             ,0x2c,pcStack_7b0);
  testing::internal::AssertHelper::operator=(&local_988,local_980);
  testing::internal::AssertHelper::~AssertHelper(&local_988);
  testing::Message::~Message(local_980);
LAB_00461786:
  cfd::core::Pubkey::~Pubkey((Pubkey *)&gtest_msg);
  cfd::core::Address::~Address
            ((Address *)
             &key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, EmptyAddressTest) {
  ElementsConfidentialAddress empty_address;
  EXPECT_STREQ("",
               empty_address.GetUnblindedAddress().GetHash().GetHex().c_str());
  EXPECT_STREQ("", empty_address.GetConfidentialKey().GetHex().c_str());

  Address unblind_addr;
  ConfidentialKey key;
  EXPECT_THROW((empty_address = ElementsConfidentialAddress("")), CfdException);
  EXPECT_THROW((empty_address = ElementsConfidentialAddress(unblind_addr, key)),
               CfdException);
}